

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::assessSmallValues
          (HighsSparseMatrix *this,HighsLogOptions *log_options,double small_matrix_value)

{
  pointer pdVar1;
  ulong uVar2;
  ulong uVar3;
  HighsInt vecDim;
  ulong uVar4;
  double dVar5;
  double dVar6;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  pdVar1 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar1) >> 3;
  uVar2 = 0;
  vecDim = (HighsInt)uVar4;
  uVar3 = 0;
  if (0 < vecDim) {
    uVar3 = uVar4 & 0xffffffff;
  }
  dVar5 = INFINITY;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar6 = ABS(pdVar1[uVar2]);
    if (dVar6 <= dVar5) {
      dVar5 = dVar6;
    }
  }
  if (dVar5 <= small_matrix_value) {
    std::__cxx11::string::string((string *)&local_38,"Small values in matrix",&local_59);
    std::__cxx11::string::string((string *)&local_58,"",&local_5a);
    analyseVectorValues(log_options,&local_38,vecDim,&this->value_,false,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void HighsSparseMatrix::assessSmallValues(const HighsLogOptions& log_options,
                                          const double small_matrix_value) {
  double min_value = kHighsInf;
  const HighsInt num_values = this->value_.size();
  for (HighsInt iX = 0; iX < num_values; iX++)
    min_value = std::min(std::abs(this->value_[iX]), min_value);
  if (min_value > small_matrix_value) return;
  analyseVectorValues(&log_options, "Small values in matrix", num_values,
                      this->value_, false, "");
}